

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qline.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *stream,QLine *line)

{
  QDataStream *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  QPoint p2;
  QPoint p1;
  QPoint *this;
  QPoint *in_stack_ffffffffffffffc0;
  QLine local_28;
  QPoint local_18;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  this = &local_10;
  QPoint::QPoint(this);
  local_18 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QPoint::QPoint(this);
  operator>>(in_RSI,in_stack_ffffffffffffffc0);
  operator>>(in_RSI,in_stack_ffffffffffffffc0);
  QLine::QLine(&local_28,this,&local_18);
  *(int *)&in_RSI->d = local_28.pt1.xp.m_i;
  *(int *)((long)&in_RSI->d + 4) = local_28.pt1.yp.m_i;
  *(int *)&in_RSI->dev = local_28.pt2.xp.m_i;
  *(int *)((long)&in_RSI->dev + 4) = local_28.pt2.yp.m_i;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QLine &line)
{
    QPoint p1, p2;
    stream >> p1;
    stream >> p2;
    line = QLine(p1, p2);

    return stream;
}